

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.c
# Opt level: O1

void run_merge_count_task(work_item *work_item,size_t thread_id)

{
  work_item *pwVar1;
  work_fn_t p_Var2;
  work_item *pwVar3;
  work_item *pwVar4;
  merge_count_task *merge_count_task;
  work_item *pwVar5;
  bool bVar6;
  
  work_item[2].next = (work_item *)0x0;
  work_item[3].work_fn = (work_fn_t)0x0;
  pwVar4 = (work_item *)work_item[1].work_fn;
  pwVar1 = work_item[1].next;
  if (pwVar4 < pwVar1) {
    p_Var2 = work_item[2].work_fn;
    do {
      pwVar3 = *(work_item **)(p_Var2 + (long)pwVar4 * 8);
      bVar6 = pwVar4 != *(work_item **)(p_Var2 + (long)pwVar3 * 8);
      pwVar5 = (work_item *)&work_item[2].next;
      if (bVar6) {
        pwVar5 = work_item + 3;
      }
      pwVar5->work_fn = pwVar5->work_fn + (bVar6 || pwVar4 < pwVar3);
      pwVar4 = (work_item *)((long)&pwVar4->work_fn + 1);
    } while (pwVar1 != pwVar4);
  }
  return;
}

Assistant:

static void run_merge_count_task(struct work_item* work_item, size_t thread_id) {
    IGNORE(thread_id);
    struct merge_count_task* merge_count_task = (void*)work_item;
    merge_count_task->merged_count = merge_count_task->unmerged_count = 0;
    for (size_t i = merge_count_task->begin, n = merge_count_task->end; i < n; ++i) {
        size_t j = merge_count_task->neighbors[i];
        if (merge_count_task->neighbors[j] == i)
            merge_count_task->merged_count += i < j ? 1 : 0;
        else
            merge_count_task->unmerged_count++;
    }
}